

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void MIR_gen_set_debug_level(MIR_context_t ctx,int level)

{
  gen_ctx_t *ppgVar1;
  gen_ctx_t gen_ctx;
  int level_local;
  MIR_context_t ctx_local;
  
  ppgVar1 = gen_ctx_loc(ctx);
  if (*ppgVar1 == (gen_ctx_t)0x0) {
    fprintf(_stderr,"Calling MIR_gen_set_debug_level before MIR_gen_init -- good bye\n");
    exit(1);
  }
  (*ppgVar1)->debug_level = level;
  return;
}

Assistant:

void MIR_gen_set_debug_level (MIR_context_t ctx, int level) {
#if !MIR_NO_GEN_DEBUG
  gen_ctx_t gen_ctx = *gen_ctx_loc (ctx);
  if (gen_ctx == NULL) {
    fprintf (stderr, "Calling MIR_gen_set_debug_level before MIR_gen_init -- good bye\n");
    exit (1);
  }
  debug_level = level;
#endif
}